

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O3

int OpenMD::LUFactorLinearSystem<OpenMD::SquareMatrix<double,6>>
              (SquareMatrix<double,_6> *A,int *index,int size,ElemPoinerType tmpSize)

{
  ulong uVar1;
  double (*padVar2) [6];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double (*padVar6) [6];
  ulong uVar7;
  double *pdVar8;
  double (*padVar9) [6];
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  if (0 < size) {
    uVar5 = (ulong)(uint)size;
    uVar1 = 0;
    padVar6 = (double (*) [6])A;
    do {
      uVar3 = 0;
      dVar12 = 0.0;
      do {
        dVar11 = ABS(((RectMatrix<double,_6U,_6U> *)*padVar6)->data_[0][uVar3]);
        if (dVar11 <= dVar12) {
          dVar11 = dVar12;
        }
        uVar3 = uVar3 + 1;
        dVar12 = dVar11;
      } while (uVar5 != uVar3);
      if ((dVar11 == 0.0) && (!NAN(dVar11))) goto LAB_0026a8c7;
      tmpSize[uVar1] = 1.0 / dVar11;
      uVar1 = uVar1 + 1;
      padVar6 = padVar6 + 1;
    } while (uVar1 != uVar5);
    if (0 < size) {
      padVar6 = (A->super_RectMatrix<double,_6U,_6U>).data_;
      uVar3 = 0;
      uVar7 = 1;
      uVar1 = 0;
      do {
        padVar6 = padVar6 + 1;
        if (uVar3 != 0) {
          uVar10 = 0;
          padVar9 = (double (*) [6])A;
          do {
            dVar12 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar10][uVar3];
            if (uVar10 != 0) {
              uVar4 = 0;
              pdVar8 = (A->super_RectMatrix<double,_6U,_6U>).data_[0] + uVar3;
              do {
                dVar12 = dVar12 - ((RectMatrix<double,_6U,_6U> *)*padVar9)->data_[0][uVar4] *
                                  *pdVar8;
                uVar4 = uVar4 + 1;
                pdVar8 = pdVar8 + 6;
              } while (uVar10 != uVar4);
            }
            (A->super_RectMatrix<double,_6U,_6U>).data_[uVar10][uVar3] = dVar12;
            uVar10 = uVar10 + 1;
            padVar9 = padVar9 + 1;
          } while (uVar10 != uVar3);
        }
        padVar9 = (A->super_RectMatrix<double,_6U,_6U>).data_ + uVar3;
        dVar12 = 0.0;
        padVar2 = padVar9;
        uVar10 = uVar3;
        do {
          dVar11 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar10][uVar3];
          if (uVar3 != 0) {
            uVar4 = 0;
            pdVar8 = (A->super_RectMatrix<double,_6U,_6U>).data_[0] + uVar3;
            do {
              dVar11 = dVar11 - (*padVar2)[uVar4] * *pdVar8;
              uVar4 = uVar4 + 1;
              pdVar8 = pdVar8 + 6;
            } while (uVar3 != uVar4);
          }
          (A->super_RectMatrix<double,_6U,_6U>).data_[uVar10][uVar3] = dVar11;
          dVar11 = ABS(dVar11) * tmpSize[uVar10];
          if (dVar12 <= dVar11) {
            uVar1 = uVar10 & 0xffffffff;
          }
          dVar12 = (double)(-(ulong)(dVar11 < dVar12) & (ulong)dVar12 |
                           ~-(ulong)(dVar11 < dVar12) & (ulong)dVar11);
          uVar10 = uVar10 + 1;
          padVar2 = padVar2 + 1;
        } while (uVar10 != uVar5);
        if (uVar3 != uVar1) {
          uVar10 = 0;
          do {
            dVar12 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar1][uVar10];
            (A->super_RectMatrix<double,_6U,_6U>).data_[uVar1][uVar10] = (*padVar9)[uVar10];
            (*padVar9)[uVar10] = dVar12;
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
          tmpSize[(int)uVar1] = tmpSize[uVar3];
        }
        index[uVar3] = (int)uVar1;
        dVar12 = *(double *)((long)(A->super_RectMatrix<double,_6U,_6U>).data_ + uVar3 * 0x38);
        if (ABS(dVar12) <= 1e-12) {
LAB_0026a8c7:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unable to factor linear system",0x1e);
          return 0;
        }
        if ((uVar3 != size - 1) && ((long)(uVar3 + 1) < (long)uVar5)) {
          pdVar8 = *padVar6 + uVar3;
          uVar10 = uVar5;
          do {
            *pdVar8 = *pdVar8 * (1.0 / dVar12);
            pdVar8 = pdVar8 + 6;
            uVar10 = uVar10 - 1;
          } while (uVar7 != uVar10);
        }
        uVar3 = uVar3 + 1;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar5);
    }
  }
  return 1;
}

Assistant:

int LUFactorLinearSystem(MatrixType& A, int* index, int size,
                           typename MatrixType::ElemPoinerType tmpSize) {
    using Real = typename MatrixType::ElemType;

    int i, j, k;
    int maxI = 0;
    Real largest, temp1, temp2, sum;

    //
    // Loop over rows to get implicit scaling information
    //
    for (i = 0; i < size; ++i) {
      for (largest = 0.0, j = 0; j < size; ++j) {
        if ((temp2 = std::abs(A(i, j))) > largest) { largest = temp2; }
      }

      if (largest == 0.0) {
        std::cerr << "Unable to factor linear system";
        return 0;
      }
      tmpSize[i] = 1.0 / largest;
    }
    //
    // Loop over all columns using Crout's method
    //
    for (j = 0; j < size; ++j) {
      for (i = 0; i < j; ++i) {
        sum = A(i, j);
        for (k = 0; k < i; ++k) {
          sum -= A(i, k) * A(k, j);
        }
        A(i, j) = sum;
      }
      //
      // Begin search for largest pivot element
      //
      for (largest = 0.0, i = j; i < size; ++i) {
        sum = A(i, j);
        for (k = 0; k < j; ++k) {
          sum -= A(i, k) * A(k, j);
        }
        A(i, j) = sum;

        if ((temp1 = tmpSize[i] * std::abs(sum)) >= largest) {
          largest = temp1;
          maxI    = i;
        }
      }
      //
      // Check for row interchange
      //
      if (j != maxI) {
        for (k = 0; k < size; ++k) {
          std::swap(A(maxI, k), A(j, k));
        }
        tmpSize[maxI] = tmpSize[j];
      }
      //
      // Divide by pivot element and perform elimination
      //
      index[j] = maxI;

      if (std::abs(A(j, j)) <= SMALL_NUMBER) {
        std::cerr << "Unable to factor linear system";
        return false;
      }

      if (j != (size - 1)) {
        temp1 = 1.0 / A(j, j);
        for (i = j + 1; i < size; ++i) {
          A(i, j) *= temp1;
        }
      }
    }

    return 1;
  }